

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdomhelpers.cpp
# Opt level: O0

bool __thiscall
QDomBuilder::notationDecl(QDomBuilder *this,QString *name,QString *publicId,QString *systemId)

{
  QString *sys;
  QDomDocumentTypePrivate *pQVar1;
  QDomNodePrivate *in_RCX;
  QDomDocumentPrivate *in_RDX;
  QDomNotationPrivate *in_RSI;
  QString *in_RDI;
  QDomNotationPrivate *n;
  QString *in_stack_ffffffffffffffd8;
  
  sys = (QString *)operator_new(0xd8);
  QDomNotationPrivate::QDomNotationPrivate
            (in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8,in_RDI,sys);
  QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x12f92f);
  pQVar1 = QDomDocumentPrivate::doctype((QDomDocumentPrivate *)0x12f93d);
  (*(pQVar1->super_QDomNodePrivate)._vptr_QDomNodePrivate[7])(pQVar1,sys);
  return true;
}

Assistant:

bool QDomBuilder::notationDecl(const QString &name, const QString &publicId,
                               const QString &systemId)
{
    QDomNotationPrivate *n = new QDomNotationPrivate(doc, nullptr, name, publicId, systemId);
    // keep the refcount balanced: appendChild() does a ref anyway.
    n->ref.deref();
    doc->doctype()->appendChild(n);
    return true;
}